

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

OpenCLDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetOpenCL100DebugOpcode(Instruction *this)

{
  uint32_t uVar1;
  OpenCLDebugInfo100Instructions OVar2;
  FeatureManager *pFVar3;
  
  if (this->opcode_ == OpExtInst) {
    pFVar3 = IRContext::get_feature_mgr(this->context_);
    if (pFVar3->extinst_importid_OpenCL100DebugInfo_ != 0) {
      uVar1 = GetSingleWordInOperand(this,0);
      pFVar3 = IRContext::get_feature_mgr(this->context_);
      if (uVar1 == pFVar3->extinst_importid_OpenCL100DebugInfo_) {
        OVar2 = GetSingleWordInOperand(this,1);
        return OVar2;
      }
    }
  }
  return OpenCLDebugInfo100InstructionsMax;
}

Assistant:

OpenCLDebugInfo100Instructions Instruction::GetOpenCL100DebugOpcode() const {
  if (opcode() != spv::Op::OpExtInst) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  return OpenCLDebugInfo100Instructions(
      GetSingleWordInOperand(kExtInstInstructionInIdx));
}